

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_buf.c
# Opt level: O0

ngx_buf_t * ngx_create_temp_buf(ngx_pool_t *pool,size_t size)

{
  void *pvVar1;
  ngx_buf_t *b;
  size_t size_local;
  ngx_pool_t *pool_local;
  
  pool_local = (ngx_pool_t *)ngx_pcalloc(pool,0x50);
  if (pool_local == (ngx_pool_t *)0x0) {
    pool_local = (ngx_pool_t *)0x0;
  }
  else {
    pvVar1 = ngx_palloc(pool,size);
    pool_local->max = (size_t)pvVar1;
    if (pool_local->max == 0) {
      pool_local = (ngx_pool_t *)0x0;
    }
    else {
      (pool_local->d).last = (u_char *)pool_local->max;
      (pool_local->d).end = (u_char *)pool_local->max;
      pool_local->current = (ngx_pool_t *)((pool_local->d).end + size);
      *(ushort *)&pool_local->log = *(ushort *)&pool_local->log & 0xfffe | 1;
    }
  }
  return (ngx_buf_t *)pool_local;
}

Assistant:

ngx_buf_t *
ngx_create_temp_buf(ngx_pool_t *pool, size_t size)
{
    ngx_buf_t *b;

    b = ngx_calloc_buf(pool);
    if (b == NULL) {
        return NULL;
    }

    b->start = ngx_palloc(pool, size);
    if (b->start == NULL) {
        return NULL;
    }

    /*
     * set by ngx_calloc_buf():
     *
     *     b->file_pos = 0;
     *     b->file_last = 0;
     *     b->file = NULL;
     *     b->shadow = NULL;
     *     b->tag = 0;
     *     and flags
     */

    b->pos = b->start;
    b->last = b->start;
    b->end = b->last + size;
    b->temporary = 1;

    return b;
}